

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::_addColReal(SoPlexBase<double> *this,LPColReal *lpcol)

{
  double dVar1;
  SPxLPBase<double> *pSVar2;
  VarStatus *t;
  VarStatus local_1c [3];
  
  pSVar2 = this->_realLP;
  (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[10])
            (pSVar2,lpcol,(ulong)pSVar2->_isScaled);
  if (this->_isRealLPLoaded == true) {
    this->_hasBasis = NO_PROBLEM < (this->_solver).super_SPxBasisBase<double>.thestatus;
  }
  else if (this->_hasBasis == true) {
    dVar1 = this->_currentSettings->_realParamValues[6];
    if (lpcol->low <= -dVar1) {
      if (dVar1 < lpcol->up || dVar1 == lpcol->up) {
        t = local_1c;
        local_1c[0] = ZERO;
      }
      else {
        t = local_1c + 1;
        local_1c[1] = 0;
      }
    }
    else {
      t = local_1c + 2;
      local_1c[2] = 1;
    }
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::append(&this->_basisStatusCols,t);
  }
  SLUFactorRational::clear(&this->_rationalLUSolver);
  return;
}

Assistant:

void SoPlexBase<R>::_addColReal(const LPColReal& lpcol)
{
   assert(_realLP != nullptr);

   bool scale = _realLP->isScaled();
   _realLP->addCol(lpcol, scale);

   if(_isRealLPLoaded)
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
   else if(_hasBasis)
   {
      if(lpcol.lower() > -realParam(SoPlexBase<R>::INFTY))
         _basisStatusCols.append(SPxSolverBase<R>::ON_LOWER);
      else if(lpcol.upper() < realParam(SoPlexBase<R>::INFTY))
         _basisStatusCols.append(SPxSolverBase<R>::ON_UPPER);
      else
         _basisStatusCols.append(SPxSolverBase<R>::ZERO);
   }

   _rationalLUSolver.clear();
}